

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.hpp
# Opt level: O0

void __thiscall
Diligent::BottomLevelASBase<Diligent::EngineVkImplTraits>::BottomLevelASBase
          (BottomLevelASBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,BottomLevelASDesc *Desc,bool bIsDeviceInternal)

{
  RenderDeviceVkImpl *this_00;
  DeviceFeatures *pDVar1;
  bool bIsDeviceInternal_local;
  BottomLevelASDesc *Desc_local;
  RenderDeviceImplType *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  BottomLevelASBase<Diligent::EngineVkImplTraits> *this_local;
  
  DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                     ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
  ).super_ObjectBase<Diligent::IBottomLevelASVk>.super_RefCountedObject<Diligent::IBottomLevelASVk>.
  super_IBottomLevelASVk.super_IBottomLevelAS.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_013a0688;
  this->m_State = RESOURCE_STATE_UNKNOWN;
  std::
  unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
  ::unordered_map(&this->m_NameToIndex);
  this->m_pRawPtr = (void *)0x0;
  this->m_GeometryCount = 0;
  ScratchBufferSizes::ScratchBufferSizes(&this->m_ScratchSize);
  std::atomic<unsigned_int>::atomic(&this->m_DvpVersion,0);
  this_00 = DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                       );
  pDVar1 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetFeatures
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_00);
  if (pDVar1->RayTracing == DEVICE_FEATURE_STATE_DISABLED) {
    LogError<true,char[44]>
              (false,"BottomLevelASBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BottomLevelASBase.hpp"
               ,0x61,(char (*) [44])"Ray tracing is not supported by this device");
  }
  ValidateBottomLevelASDesc
            (&(this->
              super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
              ).m_Desc);
  if (Desc->CompactedSize == 0) {
    CopyGeometryDescriptionUnsafe(this,Desc,(BLASNameToIndex *)0x0);
  }
  return;
}

Assistant:

BottomLevelASBase(IReferenceCounters*      pRefCounters,
                      RenderDeviceImplType*    pDevice,
                      const BottomLevelASDesc& Desc,
                      bool                     bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal}
    {
        if (!this->GetDevice()->GetFeatures().RayTracing)
            LOG_ERROR_AND_THROW("Ray tracing is not supported by this device");

        ValidateBottomLevelASDesc(this->m_Desc);

        if (Desc.CompactedSize > 0)
        {
        }
        else
        {
            CopyGeometryDescriptionUnsafe(Desc, nullptr);
        }
    }